

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconvert_linux.c
# Opt level: O0

void CharConvSS(charconv *CC,char *Out,size_t OutLen,char *In)

{
  size_t sVar1;
  char *pcVar2;
  char *local_58;
  size_t n;
  size_t _OutLen;
  char *_Out;
  size_t _InLen;
  char *_In;
  char *In_local;
  size_t OutLen_local;
  char *Out_local;
  charconv *CC_local;
  
  if (OutLen != 0) {
    _InLen = (size_t)In;
    _In = In;
    In_local = (char *)OutLen;
    OutLen_local = (size_t)Out;
    Out_local = (char *)CC;
    sVar1 = strlen(In);
    _Out = (char *)(sVar1 + 1);
    _OutLen = OutLen_local;
    n = (size_t)In_local;
    if ((((Out_local == (char *)0x0) || (_Out == (char *)0x0)) ||
        (sVar1 = iconv(Out_local,(char **)&_InLen,(size_t *)&_Out,(char **)&_OutLen,&n),
        sVar1 == 0xffffffffffffffff)) ||
       (sVar1 = iconv(Out_local,(char **)0x0,(size_t *)0x0,(char **)&_OutLen,&n),
       sVar1 == 0xffffffffffffffff)) {
      pcVar2 = (char *)strlen(_In);
      if (In_local + -1 < pcVar2) {
        local_58 = In_local + -1;
      }
      else {
        local_58 = (char *)strlen(_In);
      }
      memcpy((void *)OutLen_local,_In,(size_t)local_58);
      local_58[OutLen_local] = '\0';
      if ((Out_local != (char *)0x0) && (_Out != (char *)0x0)) {
        iconv(Out_local,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
      }
    }
    else {
      *(undefined1 *)_OutLen = 0;
    }
  }
  return;
}

Assistant:

void CharConvSS(charconv* CC, char* Out, size_t OutLen, const char* In)
{
    if (OutLen>0)
    {
        ICONV_CONST char* _In = (ICONV_CONST char*)In;
        size_t _InLen = strlen(In)+1;
        char* _Out = Out;
        size_t _OutLen = OutLen;

        if (!CC || !_InLen || iconv((iconv_t)CC, &_In, &_InLen, &_Out, &_OutLen) == (size_t)-1 ||
             iconv((iconv_t)CC, NULL, NULL, &_Out, &_OutLen) == (size_t)-1)
        {
            size_t n = MIN(strlen(In),OutLen-1);
            memcpy(Out,In,n*sizeof(char));
            Out[n] = 0;
            if (CC && _InLen)
            {
//              DebugMessage("iconv failed: %d for '%s'",errno,In);
              iconv((iconv_t)CC, NULL, NULL, NULL, NULL); // reset state
            }
        }
        else
            *_Out=0;
    }
}